

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STBase.cpp
# Opt level: O2

Value __thiscall jbcoin::STBase::getJson(STBase *this,int param_1)

{
  undefined8 extraout_RDX;
  undefined4 in_register_00000034;
  Value VVar1;
  string local_30;
  
  (**(code **)(*(long *)CONCAT44(in_register_00000034,param_1) + 0x30))(&local_30);
  Json::Value::Value((Value *)this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  VVar1._8_8_ = extraout_RDX;
  VVar1.value_.map_ = (ObjectValues *)this;
  return VVar1;
}

Assistant:

Json::Value
STBase::getJson (int /*options*/) const
{
    return getText();
}